

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Texture2DFormatCase::init(Texture2DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *str;
  deUint32 dataType;
  TestLog *pTVar1;
  int iVar2;
  ostream *poVar3;
  MessageBuilder *pMVar4;
  Texture2D *this_00;
  Enum<int,_2UL> local_3a0 [2];
  TextureFormat local_380;
  LogGradientFmt local_378;
  TextureFormatInfo spec;
  ostringstream fmtName;
  undefined1 local_1b0 [8];
  deUint32 local_1a8;
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  if (this->m_dataType == 0) {
    local_380 = glu::mapGLInternalFormat(this->m_format);
  }
  else {
    local_380 = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  }
  tcu::getTextureFormatInfo(&spec,&local_380);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fmtName);
  if (this->m_dataType == 0) {
    local_1a8 = this->m_format;
    local_1b0 = (undefined1  [8])glu::getTextureFormatName;
    tcu::Format::Enum<int,_2UL>::toStream
              ((Enum<int,_2UL> *)local_1b0,
               &fmtName.super_basic_ostream<char,_std::char_traits<char>_>);
  }
  else {
    local_1a8 = this->m_format;
    local_1b0 = (undefined1  [8])glu::getTextureFormatName;
    poVar3 = tcu::Format::Enum<int,_2UL>::toStream
                       ((Enum<int,_2UL> *)local_1b0,
                        &fmtName.super_basic_ostream<char,_std::char_traits<char>_>);
    poVar3 = std::operator<<(poVar3,", ");
    local_3a0[0].m_value = this->m_dataType;
    local_3a0[0].m_getName = glu::getTypeName;
    tcu::Format::Enum<int,_2UL>::toStream(local_3a0,poVar3);
  }
  local_1b0 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,"2D texture, ");
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&local_1a8,(string *)local_3a0);
  std::operator<<((ostream *)&local_1a8,", ");
  pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_width);
  std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_height);
  str = &pMVar4->m_str;
  std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,",\n  fill with ");
  local_378.valueMin = &spec.valueMin;
  local_378.valueMax = &spec.valueMax;
  glu::TextureTestUtil::operator<<
            (&str->super_basic_ostream<char,_std::char_traits<char>_>,&local_378);
  std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>," gradient");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)local_3a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  dataType = this->m_dataType;
  if (dataType == 0) {
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D(this_00,this->m_renderCtx,this->m_format,this->m_width,this->m_height)
    ;
  }
  else {
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,this->m_renderCtx,this->m_format,dataType,this->m_width,this->m_height);
  }
  this->m_texture = this_00;
  tcu::Texture2D::allocLevel(&this_00->m_refTexture,0);
  tcu::fillWithComponentGradients
            ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&spec.valueMin,&spec.valueMax);
  iVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fmtName);
  return iVar2;
}

Assistant:

void Texture2DFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= m_dataType ? glu::mapGLTransferFormat(m_format, m_dataType) : glu::mapGLInternalFormat(m_format);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	if (m_dataType)
		fmtName << glu::getTextureFormatStr(m_format) << ", " << glu::getTypeStr(m_dataType);
	else
		fmtName << glu::getTextureFormatStr(m_format);

	log << TestLog::Message << "2D texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	m_texture = m_dataType != GL_NONE
			  ? new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height)	// Implicit internal format.
			  : new glu::Texture2D(m_renderCtx, m_format, m_width, m_height);				// Explicit internal format.

	// Fill level 0.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), spec.valueMin, spec.valueMax);
}